

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmudp.c
# Opt level: O0

CMConnection
libcmudp_LTX_initiate_conn
          (CManager cm,CMtrans_services_conflict svc,transport_entry_conflict trans,attr_list attrs)

{
  int iVar1;
  udp_conn_data_ptr ucd;
  attr_list p_Var2;
  undefined8 in_RDX;
  long in_RSI;
  CMConnection conn;
  attr_list conn_attr_list;
  udp_conn_data_ptr udp_conn_data;
  CMtrans_services_conflict in_stack_00000040;
  CManager in_stack_00000048;
  CMtrans_services_conflict in_stack_ffffffffffffffc0;
  CMConnection local_8;
  
  ucd = create_udp_conn_data(in_stack_ffffffffffffffc0);
  p_Var2 = (attr_list)create_attr_list();
  iVar1 = initiate_udp_conn(in_stack_00000048,in_stack_00000040,(transport_entry_conflict)cm,
                            (attr_list)svc,(udp_conn_data_ptr)trans,attrs);
  if (iVar1 == 1) {
    add_attr(p_Var2,CM_UDP_ADDR,1,(long)ucd->udp_IP);
    add_attr(p_Var2,CM_UDP_PORT,1,(long)ucd->udp_port);
    local_8 = (CMConnection)(**(code **)(in_RSI + 0x40))(in_RDX,ucd,p_Var2);
    add_connection(ucd->utd,ucd);
    ucd->conn = local_8;
    ucd->attrs = p_Var2;
    (**(code **)(in_RSI + 0xd8))(local_8);
  }
  else {
    local_8 = (CMConnection)0x0;
  }
  return local_8;
}

Assistant:

extern CMConnection
libcmudp_LTX_initiate_conn(CManager cm, CMtrans_services svc, transport_entry trans, attr_list attrs)
{
    udp_conn_data_ptr udp_conn_data = create_udp_conn_data(svc);
    attr_list conn_attr_list = create_attr_list();
    CMConnection conn;

    if (initiate_udp_conn(cm, svc, trans, attrs, udp_conn_data, conn_attr_list) != 1) {
	return NULL;
    }

    add_attr(conn_attr_list, CM_UDP_ADDR, Attr_Int4,
	     (attr_value) (long)udp_conn_data->udp_IP);
    add_attr(conn_attr_list, CM_UDP_PORT, Attr_Int4,
	     (attr_value) (long)udp_conn_data->udp_port);

    conn = svc->connection_create(trans, udp_conn_data, conn_attr_list);
    add_connection(udp_conn_data->utd, udp_conn_data);
    udp_conn_data->conn = conn;
    udp_conn_data->attrs = conn_attr_list;
    svc->connection_addref(conn);  /* one ref count went to select (and CM), 
				the other to the user */
    return conn;
}